

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_unitAttributeMultiplier_Test::TestBody(Units_unitAttributeMultiplier_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_110 [8];
  Message local_108 [8];
  double local_100;
  double local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8 [8];
  double local_d0;
  double local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [32];
  AssertHelper local_60 [8];
  Message local_58 [24];
  double local_40;
  double local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  UnitsPtr u;
  Units_unitAttributeMultiplier_Test *this_local;
  
  libcellml::Units::create();
  local_38 = 1.0;
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  local_40 = (double)libcellml::Units::unitAttributeMultiplier((ulong)peVar2);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_30,"1.0","u->unitAttributeMultiplier(0)",&local_38,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x33d,pcVar3);
    testing::internal::AssertHelper::operator=(local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"NewUnit",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar2,(int)local_80,1.05,17.0,(string *)0x4);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  local_c8 = 17.0;
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  local_d0 = (double)libcellml::Units::unitAttributeMultiplier((ulong)peVar2);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_c0,"17.0","u->unitAttributeMultiplier(0)",&local_c8,&local_d0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x340,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f8 = 1.0;
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  local_100 = (double)libcellml::Units::unitAttributeMultiplier((ulong)peVar2);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_f0,"1.0","u->unitAttributeMultiplier(5)",&local_f8,&local_100)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x341,pcVar3);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&gtest_ar.message_)
  ;
  return;
}

Assistant:

TEST(Units, unitAttributeMultiplier)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    EXPECT_EQ(1.0, u->unitAttributeMultiplier(0));
    u->addUnit("NewUnit", 4, 1.05, 17.0);

    EXPECT_EQ(17.0, u->unitAttributeMultiplier(0));
    EXPECT_EQ(1.0, u->unitAttributeMultiplier(5));
}